

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

void swrenderer::R_DrawFogBoundary(int x1,int x2,short *uclip,short *dclip)

{
  bool bVar1;
  double dVar2;
  long *plVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  SWORD *b2_1;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint i;
  ulong uVar11;
  SWORD *b2;
  uint uVar12;
  short sVar13;
  long lVar14;
  int iVar15;
  short *psVar16;
  double dVar17;
  int y;
  int xr;
  int y_1;
  uint local_84;
  int local_80;
  int local_7c;
  short *local_78;
  double local_70;
  ulong local_68;
  short *local_60;
  int local_54;
  uint local_50;
  int local_4c;
  long local_48;
  long local_40;
  long local_38;
  
  plVar3 = basecolormap;
  dVar17 = (double)((float)(~x1 + x2) * rw_lightstep + rw_light);
  uVar10 = (uint)uclip[(long)x2 + -1];
  uVar12 = (uint)dclip[(long)x2 + -1];
  dVar2 = 24.0;
  if (dVar17 <= 24.0) {
    dVar2 = dVar17;
  }
  iVar4 = wallshade - SUB84(dVar2 + 103079215104.0,0) >> 0x10;
  iVar15 = 0x1f;
  if (iVar4 < 0x1f) {
    iVar15 = iVar4;
  }
  iVar4 = 0;
  if (0 < iVar15) {
    iVar4 = iVar15;
  }
  local_48 = *basecolormap;
  if (uclip[(long)x2 + -1] < dclip[(long)x2 + -1]) {
    uVar11 = 0;
    do {
      spanend[(long)(int)uVar10 + uVar11] = (short)x2 + -1;
      uVar11 = uVar11 + 1;
    } while (uVar12 - uVar10 != uVar11);
  }
  iVar6 = 0;
  if (0 < iVar15) {
    iVar6 = iVar15;
  }
  drawerargs::dc_colormap = (ulong)(uint)(iVar6 << 8) + local_48;
  local_78 = uclip;
  local_54 = x1;
  if (x1 <= x2 + -2) {
    local_40 = (ulong)(uint)(iVar4 << 8) + *plVar3;
    local_38 = (long)x1;
    lVar14 = (long)(x2 + -2);
    local_60 = dclip;
    do {
      uVar11 = (ulong)uVar12;
      uVar8 = (uint)uclip[lVar14];
      uVar5 = (uint)local_60[lVar14];
      local_68 = (ulong)uVar5;
      local_80 = (int)lVar14 + 1;
      dVar17 = dVar17 - (double)rw_lightstep;
      dVar2 = dVar17;
      if (24.0 <= dVar17) {
        dVar2 = 24.0;
      }
      iVar6 = SUB84(dVar2 + 103079215104.0,0);
      iVar15 = wallshade - iVar6 >> 0x10;
      if (0x1e < iVar15) {
        iVar15 = 0x1f;
      }
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      sVar13 = (short)lVar14;
      if (iVar15 == iVar4) {
        uVar7 = uVar12;
        if ((int)uVar8 < (int)uVar12) {
          uVar7 = uVar8;
        }
        local_7c = iVar4;
        local_50 = uVar8;
        if (local_40 == local_48) {
          if ((int)uVar10 <= (int)uVar7) {
            uVar10 = uVar7;
          }
          uVar8 = uVar10;
          if ((int)uVar10 < (int)uVar5) {
            uVar8 = uVar5;
          }
          if ((int)uVar8 <= (int)uVar12) {
            uVar11 = (ulong)uVar8;
          }
        }
        else {
          local_70 = dVar17;
          if ((int)uVar10 < (int)uVar7) {
            psVar16 = spanend + (int)uVar10;
            lVar9 = (long)(int)uVar7 - (long)(int)uVar10;
            do {
              local_84 = uVar10;
              DrawerCommandQueue::
              QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,int&,int_const&,short&>
                        ((int *)&local_84,&local_80,psVar16);
              psVar16 = psVar16 + 1;
              uVar10 = uVar10 + 1;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          uVar5 = (uint)local_68;
          uVar8 = uVar10;
          if ((int)uVar10 < (int)uVar5) {
            uVar8 = uVar5;
          }
          uclip = local_78;
          dVar17 = local_70;
          if ((int)uVar8 < (int)uVar12) {
            uVar11 = (ulong)(int)uVar12;
            psVar16 = spanend + uVar11;
            do {
              psVar16 = psVar16 + -1;
              uVar11 = uVar11 - 1;
              local_4c = (int)uVar11;
              DrawerCommandQueue::
              QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,int&,int_const&,short&>
                        (&local_4c,&local_80,psVar16);
            } while ((long)(int)uVar8 < (long)uVar11);
            uVar5 = (uint)local_68;
            uclip = local_78;
            dVar17 = local_70;
          }
        }
        uVar12 = uVar5;
        if ((int)uVar10 < (int)uVar5) {
          uVar12 = uVar10;
        }
        if ((int)local_50 < (int)uVar12) {
          lVar9 = (long)(int)local_50;
          do {
            spanend[lVar9] = sVar13;
            lVar9 = lVar9 + 1;
          } while ((int)uVar12 != lVar9);
        }
        if ((int)uVar10 < (int)(uint)uVar11) {
          uVar10 = (uint)uVar11;
        }
        iVar4 = local_7c;
        if ((int)uVar10 < (int)uVar5) {
          lVar9 = (long)(int)uVar5;
          do {
            *(short *)(&DAT_0178df9e + lVar9 * 2) = sVar13;
            lVar9 = lVar9 + -1;
          } while ((int)uVar10 < lVar9);
        }
      }
      else {
        if (((int)uVar10 < (int)uVar12) && (iVar4 != 0)) {
          local_70 = dVar17;
          R_DrawFogBoundarySection(uVar10,uVar12,local_80);
          uclip = local_78;
          dVar17 = local_70;
        }
        if ((int)uVar10 < (int)uVar8) {
          uVar8 = uVar10;
        }
        uVar10 = (uint)local_68;
        if ((int)(uint)local_68 < (int)uVar12) {
          uVar10 = uVar12;
        }
        if (uVar10 - uVar8 != 0 && (int)uVar8 <= (int)uVar10) {
          uVar11 = 0;
          do {
            spanend[(long)(int)uVar8 + uVar11] = sVar13;
            uVar11 = uVar11 + 1;
          } while (uVar10 - uVar8 != uVar11);
        }
        dVar2 = (double)(float)dVar17;
        if (24.0 <= dVar2) {
          dVar2 = 24.0;
        }
        iVar4 = wallshade - SUB84(dVar2 + 103079215104.0,0) >> 0x10;
        if (0x1e < iVar4) {
          iVar4 = 0x1f;
        }
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        drawerargs::dc_colormap = (ulong)(uint)(iVar4 << 8) + *basecolormap;
        iVar4 = wallshade - iVar6 >> 0x10;
        if (0x1e < iVar4) {
          iVar4 = 0x1f;
        }
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        local_40 = (ulong)(uint)(iVar4 << 8) + *basecolormap;
        iVar4 = iVar15;
      }
      uVar10 = (uint)uclip[lVar14];
      uVar12 = (uint)local_60[lVar14];
      bVar1 = local_38 < lVar14;
      lVar14 = lVar14 + -1;
    } while (bVar1);
  }
  if (((int)uVar10 < (int)uVar12) && (iVar4 != 0)) {
    R_DrawFogBoundarySection(uVar10,uVar12,local_54);
  }
  return;
}

Assistant:

void R_DrawFogBoundary(int x1, int x2, short *uclip, short *dclip)
	{
		// This is essentially the same as R_MapVisPlane but with an extra step
		// to create new horizontal spans whenever the light changes enough that
		// we need to use a new colormap.

		double lightstep = rw_lightstep;
		double light = rw_light + rw_lightstep*(x2 - x1 - 1);
		int x = x2 - 1;
		int t2 = uclip[x];
		int b2 = dclip[x];
		int rcolormap = GETPALOOKUP(light, wallshade);
		int lcolormap;
		uint8_t *basecolormapdata = basecolormap->Maps;

		if (b2 > t2)
		{
			fillshort(spanend + t2, b2 - t2, x);
		}

		R_SetColorMapLight(basecolormap->Maps, (float)light, wallshade);

		uint8_t *fake_dc_colormap = basecolormap->Maps + (GETPALOOKUP(light, wallshade) << COLORMAPSHIFT);

		for (--x; x >= x1; --x)
		{
			int t1 = uclip[x];
			int b1 = dclip[x];
			const int xr = x + 1;
			int stop;

			light -= rw_lightstep;
			lcolormap = GETPALOOKUP(light, wallshade);
			if (lcolormap != rcolormap)
			{
				if (t2 < b2 && rcolormap != 0)
				{ // Colormap 0 is always the identity map, so rendering it is
				  // just a waste of time.
					R_DrawFogBoundarySection(t2, b2, xr);
				}
				if (t1 < t2) t2 = t1;
				if (b1 > b2) b2 = b1;
				if (t2 < b2)
				{
					fillshort(spanend + t2, b2 - t2, x);
				}
				rcolormap = lcolormap;
				R_SetColorMapLight(basecolormap->Maps, (float)light, wallshade);
				fake_dc_colormap = basecolormap->Maps + (GETPALOOKUP(light, wallshade) << COLORMAPSHIFT);
			}
			else
			{
				if (fake_dc_colormap != basecolormapdata)
				{
					stop = MIN(t1, b2);
					while (t2 < stop)
					{
						int y = t2++;
						DrawerCommandQueue::QueueCommand<DrawFogBoundaryLinePalCommand>(y, xr, spanend[y]);
					}
					stop = MAX(b1, t2);
					while (b2 > stop)
					{
						int y = --b2;
						DrawerCommandQueue::QueueCommand<DrawFogBoundaryLinePalCommand>(y, xr, spanend[y]);
					}
				}
				else
				{
					t2 = MAX(t2, MIN(t1, b2));
					b2 = MIN(b2, MAX(b1, t2));
				}

				stop = MIN(t2, b1);
				while (t1 < stop)
				{
					spanend[t1++] = x;
				}
				stop = MAX(b2, t2);
				while (b1 > stop)
				{
					spanend[--b1] = x;
				}
			}

			t2 = uclip[x];
			b2 = dclip[x];
		}
		if (t2 < b2 && rcolormap != 0)
		{
			R_DrawFogBoundarySection(t2, b2, x1);
		}
	}